

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilabel_oaa.cc
# Opt level: O1

void predict_or_learn<true>(multi_oaa *o,single_learner *base,example *ec)

{
  uint64_t *puVar1;
  wclass *pwVar2;
  wclass *pwVar3;
  ostream *poVar4;
  ulong uVar5;
  wclass *pwVar6;
  ulong uVar7;
  labels preds;
  float local_7c;
  wclass *local_78;
  wclass *local_70;
  v_array<unsigned_int> local_68;
  wclass *local_48;
  size_t sStack_40;
  
  pwVar2 = (ec->l).cs.costs._begin;
  pwVar3 = (ec->l).cs.costs._end;
  local_48 = (ec->l).cs.costs.end_array;
  sStack_40 = (ec->l).cs.costs.erase_count;
  local_68._begin = (uint *)(ec->pred).scalars._begin;
  local_68._end = (uint *)(ec->pred).scalars._end;
  local_68.end_array = (uint *)(ec->pred).scalars.end_array;
  local_68.erase_count = (ec->pred).scalars.erase_count;
  v_array<unsigned_int>::clear(&local_68);
  (ec->l).cs.costs._begin = (wclass *)0x3f8000007f7fffff;
  uVar7 = 0;
  (ec->l).simple.initial = 0.0;
  local_7c = 0.0;
  pwVar6 = pwVar2;
  local_70 = pwVar3;
  if (o->k != 0) {
    uVar5 = 0;
    local_78 = pwVar2;
    do {
      (ec->l).multi.label = 0xbf800000;
      if ((uVar7 < (ulong)((long)pwVar3 - (long)pwVar2 >> 2)) && ((&local_78->x)[uVar7] == local_7c)
         ) {
        (ec->l).multi.label = 0x3f800000;
        uVar7 = (ulong)((int)uVar7 + 1);
      }
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(base + 0xe0) * (int)uVar5);
      (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)(uint)((int)uVar5 * *(int *)(base + 0xe0));
      if (0.0 < (ec->pred).scalar) {
        v_array<unsigned_int>::push_back(&local_68,(uint *)&local_7c);
      }
      local_7c = (float)((int)local_7c + 1);
      uVar5 = (ulong)(uint)local_7c;
      pwVar6 = local_78;
    } while (uVar5 < o->k);
  }
  local_78 = (wclass *)&(ec->l).cs.costs.end_array;
  if (uVar7 < (ulong)((long)local_70 - (long)pwVar6 >> 2)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"label ",6);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," is not in {0,",0xe);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"} This won\'t work right.",0x18);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  (ec->pred).scalars.end_array = (float *)local_68.end_array;
  (ec->pred).scalars.erase_count = local_68.erase_count;
  (ec->pred).scalars._begin = (float *)local_68._begin;
  (ec->pred).scalars._end = (float *)local_68._end;
  (ec->l).cs.costs._begin = pwVar6;
  (ec->l).cs.costs._end = local_70;
  *(wclass **)local_78 = local_48;
  *(size_t *)((long)local_78 + 8) = sStack_40;
  return;
}

Assistant:

void predict_or_learn(multi_oaa& o, LEARNER::single_learner& base, example& ec)
{
  MULTILABEL::labels multilabels = ec.l.multilabels;
  MULTILABEL::labels preds = ec.pred.multilabels;
  preds.label_v.clear();

  ec.l.simple = {FLT_MAX, 1.f, 0.f};
  uint32_t multilabel_index = 0;
  for (uint32_t i = 0; i < o.k; i++)
  {
    if (is_learn)
    {
      ec.l.simple.label = -1.f;
      if (multilabels.label_v.size() > multilabel_index && multilabels.label_v[multilabel_index] == i)
      {
        ec.l.simple.label = 1.f;
        multilabel_index++;
      }
      base.learn(ec, i);
    }
    else
      base.predict(ec, i);
    if (ec.pred.scalar > 0.)
      preds.label_v.push_back(i);
  }
  if (is_learn && multilabel_index < multilabels.label_v.size())
    cout << "label " << multilabels.label_v[multilabel_index] << " is not in {0," << o.k - 1
         << "} This won't work right." << endl;

  ec.pred.multilabels = preds;
  ec.l.multilabels = multilabels;
}